

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O2

void injection::InjectionManager::bind_transient<ITest>(function<ITest_*()> *maker)

{
  function<ITest_*()> fStack_28;
  
  std::function<ITest_*()>::function(&fStack_28,maker);
  bind<ITest>(&fStack_28,TRANSIENT);
  std::_Function_base::~_Function_base(&fStack_28.super__Function_base);
  return;
}

Assistant:

static void bind_transient(std::function<I*()> maker) {
        InjectionManager::bind<I>(maker, InjectionScope::TRANSIENT);
    }